

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int element7(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  uint *puVar1;
  code *pcVar2;
  int iVar3;
  
  pcVar2 = element6;
  if (tok < 0x23) {
    if (tok == 0xf) {
      return 0;
    }
    if (tok == 0x15) {
      iVar3 = 0x2c;
      goto LAB_004e9fcf;
    }
    if (tok != 0x18) goto switchD_004e9f49_default;
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    iVar3 = 0x28;
    if (*puVar1 != 0) {
      return 0x28;
    }
  }
  else {
    switch(tok) {
    case 0x23:
      puVar1 = &state->level;
      *puVar1 = *puVar1 - 1;
      iVar3 = 0x2a;
      if (*puVar1 != 0) {
        return 0x2a;
      }
      break;
    case 0x24:
      puVar1 = &state->level;
      *puVar1 = *puVar1 - 1;
      iVar3 = 0x29;
      if (*puVar1 != 0) {
        return 0x29;
      }
      break;
    case 0x25:
      puVar1 = &state->level;
      *puVar1 = *puVar1 - 1;
      iVar3 = 0x2b;
      if (*puVar1 != 0) {
        return 0x2b;
      }
      break;
    case 0x26:
      iVar3 = 0x2d;
      goto LAB_004e9fcf;
    default:
switchD_004e9f49_default:
      iVar3 = -1;
      pcVar2 = error;
      if ((tok == 0x1c) && (state->documentEntity == 0)) {
        return 0x34;
      }
      goto LAB_004e9fcf;
    }
  }
  pcVar2 = declClose;
LAB_004e9fcf:
  state->handler = pcVar2;
  return iVar3;
}

Assistant:

static
int element7(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_CLOSE_PAREN_QUESTION:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_OPT;
  case XML_TOK_CLOSE_PAREN_PLUS:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_PLUS;
  case XML_TOK_COMMA:
    state->handler = element6;
    return XML_ROLE_GROUP_SEQUENCE;
  case XML_TOK_OR:
    state->handler = element6;
    return XML_ROLE_GROUP_CHOICE;
  }
  return common(state, tok);
}